

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O3

ggml_tensor * __thiscall
llm_graph_context::build_lora_mm(llm_graph_context *this,ggml_tensor *w,ggml_tensor *cur)

{
  float fVar1;
  ggml_tensor *pgVar2;
  ggml_context *pgVar3;
  ggml_tensor *pgVar4;
  llama_adapter_lora_weight *plVar5;
  undefined8 uVar6;
  _Hash_node_base *p_Var7;
  float fVar8;
  
  pgVar4 = (ggml_tensor *)ggml_mul_mat(this->ctx0);
  for (p_Var7 = (this->loras->_M_h)._M_before_begin._M_nxt; p_Var7 != (_Hash_node_base *)0x0;
      p_Var7 = p_Var7->_M_nxt) {
    plVar5 = llama_adapter_lora::get_weight((llama_adapter_lora *)p_Var7[1]._M_nxt,w);
    if (plVar5 != (llama_adapter_lora_weight *)0x0) {
      fVar8 = *(float *)&p_Var7[2]._M_nxt;
      fVar1 = *(float *)&p_Var7[1]._M_nxt[0xd]._M_nxt;
      pgVar2 = plVar5->b;
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        fVar8 = (fVar8 * fVar1) / (float)pgVar2->ne[0];
      }
      pgVar3 = this->ctx0;
      uVar6 = ggml_mul_mat(pgVar3,plVar5->a,cur);
      uVar6 = ggml_mul_mat(pgVar3,pgVar2,uVar6);
      uVar6 = ggml_scale(fVar8,this->ctx0,uVar6);
      pgVar4 = (ggml_tensor *)ggml_add(this->ctx0,pgVar4,uVar6);
    }
  }
  return pgVar4;
}

Assistant:

ggml_tensor * llm_graph_context::build_lora_mm(
          ggml_tensor * w,
          ggml_tensor * cur) const {
    ggml_tensor * res = ggml_mul_mat(ctx0, w, cur);

    for (const auto & lora : *loras) {
        llama_adapter_lora_weight * lw = lora.first->get_weight(w);
        if (lw == nullptr) {
            continue;
        }

        const float adapter_scale = lora.second;
        const float scale = lw->get_scale(lora.first->alpha, adapter_scale);

        ggml_tensor * ab_cur = ggml_mul_mat(
                ctx0, lw->b,
                ggml_mul_mat(ctx0, lw->a, cur)
                );

        ab_cur = ggml_scale(ctx0, ab_cur, scale);
        res = ggml_add(ctx0, res, ab_cur);
    }

    return res;
}